

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

Program __thiscall Pass3::run(Pass3 *this,Program *program)

{
  bool bVar1;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *this_00;
  reference ppTVar2;
  Function *pFVar3;
  Type *pTVar4;
  mapped_type *ppFVar5;
  Block *destination_block;
  Block *source_block;
  Function *extraout_RDX;
  Program PVar6;
  Function *new_function_1;
  Function *function_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  Program *__range1_1;
  Function *new_function;
  Type *local_e8;
  Type *type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *__range2;
  vector<const_Type_*,_std::allocator<const_Type_*>_> argument_types;
  Function *function;
  Iterator __end1;
  Iterator local_90;
  Iterator __begin1;
  Program *__range1;
  FunctionTable function_table;
  TypeTable type_table;
  Program *program_local;
  Program *new_program;
  
  Program::Program((Program *)this);
  std::
  map<const_Type_*,_const_Type_*,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  ::map((map<const_Type_*,_const_Type_*,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
         *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::map((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
         *)&__range1);
  __begin1.function = (Function *)program;
  local_90 = Program::begin(program);
  function = (Function *)Program::end(__begin1.function);
  while (bVar1 = Program::Iterator::operator!=(&local_90,(Iterator *)&function), bVar1) {
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Program::Iterator::operator*(&local_90);
    pTVar4 = Function::get_return_type
                       ((Function *)
                        argument_types.
                        super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    bVar1 = is_empty_tuple(pTVar4);
    if (!bVar1) {
      std::vector<const_Type_*,_std::allocator<const_Type_*>_>::vector
                ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)&__range2);
      this_00 = Function::get_argument_types
                          ((Function *)
                           argument_types.
                           super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      __end2 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::begin(this_00);
      type = (Type *)std::vector<const_Type_*,_std::allocator<const_Type_*>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Type_*const_*,_std::vector<const_Type_*,_std::allocator<const_Type_*>_>_>
                                         *)&type), bVar1) {
        ppTVar2 = __gnu_cxx::
                  __normal_iterator<const_Type_*const_*,_std::vector<const_Type_*,_std::allocator<const_Type_*>_>_>
                  ::operator*(&__end2);
        local_e8 = *ppTVar2;
        bVar1 = is_empty_tuple(local_e8);
        if (!bVar1) {
          new_function = (Function *)
                         transform_type((TypeTable *)
                                        &function_table._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count,local_e8);
          std::vector<const_Type_*,_std::allocator<const_Type_*>_>::push_back
                    ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)&__range2,
                     (value_type *)&new_function);
        }
        __gnu_cxx::
        __normal_iterator<const_Type_*const_*,_std::vector<const_Type_*,_std::allocator<const_Type_*>_>_>
        ::operator++(&__end2);
      }
      pFVar3 = (Function *)operator_new(0x60);
      pTVar4 = Function::get_return_type
                         ((Function *)
                          argument_types.
                          super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pTVar4 = transform_type((TypeTable *)
                              &function_table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              pTVar4);
      Function::Function(pFVar3,(vector<const_Type_*,_std::allocator<const_Type_*>_> *)&__range2,
                         pTVar4);
      Program::add_function((Program *)this,pFVar3);
      ppFVar5 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&__range1,
                             (key_type *)
                             &argument_types.
                              super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      *ppFVar5 = pFVar3;
      std::vector<const_Type_*,_std::allocator<const_Type_*>_>::~vector
                ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)&__range2);
    }
    Program::Iterator::operator++(&local_90);
  }
  __end1_1 = Program::begin(program);
  function_1 = (Function *)Program::end(program);
  while (bVar1 = Program::Iterator::operator!=(&__end1_1,(Iterator *)&function_1), bVar1) {
    new_function_1 = Program::Iterator::operator*(&__end1_1);
    pTVar4 = Function::get_return_type(new_function_1);
    bVar1 = is_empty_tuple(pTVar4);
    if (!bVar1) {
      ppFVar5 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&__range1,&new_function_1);
      pFVar3 = new_function_1;
      destination_block = Function::get_block(*ppFVar5);
      source_block = Function::get_block(new_function_1);
      evaluate((TypeTable *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (FunctionTable *)&__range1,pFVar3,destination_block,source_block);
    }
    Program::Iterator::operator++(&__end1_1);
  }
  std::
  map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~map((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
          *)&__range1);
  std::
  map<const_Type_*,_const_Type_*,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  ::~map((map<const_Type_*,_const_Type_*,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
          *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PVar6.last = extraout_RDX;
  PVar6.first = (Function *)this;
  return PVar6;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		TypeTable type_table;
		FunctionTable function_table;
		for (const Function* function: program) {
			if (is_empty_tuple(function->get_return_type())) {
				continue;
			}
			std::vector<const Type*> argument_types;
			for (const Type* type: function->get_argument_types()) {
				if (!is_empty_tuple(type)) {
					argument_types.push_back(transform_type(type_table, type));
				}
			}
			Function* new_function = new Function(argument_types, transform_type(type_table, function->get_return_type()));
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			if (is_empty_tuple(function->get_return_type())) {
				continue;
			}
			Function* new_function = function_table[function];
			evaluate(type_table, function_table, function, new_function->get_block(), function->get_block());
		}
		return new_program;
	}